

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::add(Dictionary *this,string *w)

{
  reference pvVar1;
  reference pvVar2;
  string *in_RSI;
  Dictionary *in_RDI;
  entry e;
  int32_t h;
  entry *in_stack_ffffffffffffff70;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *this_00;
  undefined4 in_stack_ffffffffffffff78;
  int iVar3;
  undefined4 in_stack_ffffffffffffff7c;
  Dictionary *in_stack_ffffffffffffff80;
  string *this_01;
  string local_60 [32];
  undefined8 local_40;
  entry_type local_38;
  int local_14;
  string *local_10;
  
  local_10 = in_RSI;
  local_14 = find(in_stack_ffffffffffffff80,
                  (string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  in_RDI->ntokens_ = in_RDI->ntokens_ + 1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->word2int_,(long)local_14);
  if (*pvVar1 == -1) {
    this_01 = local_60;
    entry::entry(in_stack_ffffffffffffff70);
    std::__cxx11::string::operator=(this_01,local_10);
    local_40 = 1;
    local_38 = getType(in_RDI,(string *)this_01);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::push_back
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)this_01,
               (value_type *)
               CONCAT44(CONCAT13(local_38,(int3)in_stack_ffffffffffffff7c),in_stack_ffffffffffffff78
                       ));
    iVar3 = in_RDI->size_;
    in_RDI->size_ = iVar3 + 1;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->word2int_,(long)local_14);
    *pvVar1 = iVar3;
    entry::~entry(in_stack_ffffffffffffff70);
  }
  else {
    this_00 = &in_RDI->words_;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->word2int_,(long)local_14);
    pvVar2 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                       (this_00,(long)*pvVar1);
    pvVar2->count = pvVar2->count + 1;
  }
  return;
}

Assistant:

void Dictionary::add(const std::string& w) {
	int32_t h = find(w);
	// std::cerr << w << "=" << h << " ";
	ntokens_++;
	if (word2int_[h] == -1) { //?
		// std::cout << "new " << w << std::endl;
		entry e;
		e.word = w;
		e.count = 1;
		e.type = getType(w);
		words_.push_back(e);
		word2int_[h] = size_++;
	} else {
		words_[word2int_[h]].count++;
	}
}